

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOptimizationTests.cpp
# Opt level: O3

ProgramData *
deqp::gles2::Performance::anon_unknown_1::defaultProgramData
          (ProgramData *__return_storage_ptr__,CaseShaderType shaderType,string *funcDefs,
          string *mainStatements)

{
  pointer pcVar1;
  long *plVar2;
  ProgramData *extraout_RAX;
  ProgramData *extraout_RAX_00;
  ProgramData *extraout_RAX_01;
  ProgramData *pPVar3;
  long *plVar4;
  long lVar5;
  string fragPrec;
  string vtxPrec;
  allocator_type local_539;
  long *local_538 [2];
  long local_528 [2];
  long *local_518;
  long local_510;
  long local_508;
  long lStack_500;
  long *local_4f8;
  long local_4f0;
  long local_4e8;
  long lStack_4e0;
  long *local_4d8;
  long local_4d0;
  long local_4c8;
  long lStack_4c0;
  long *local_4b8;
  long local_4b0;
  long local_4a8;
  undefined4 uStack_4a0;
  undefined4 uStack_49c;
  long *local_498 [2];
  long local_488 [2];
  long *local_478;
  long local_470;
  long local_468;
  long lStack_460;
  long *local_458;
  long local_450;
  long local_448;
  long lStack_440;
  long *local_438;
  long local_430;
  long local_428;
  long lStack_420;
  long *local_418;
  long local_410;
  long local_408;
  undefined4 uStack_400;
  undefined4 uStack_3fc;
  long *local_3f8;
  long local_3f0;
  long local_3e8;
  undefined4 uStack_3e0;
  undefined4 uStack_3dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  long *local_398 [2];
  long local_388 [2];
  long *local_378;
  long local_370;
  long local_368;
  undefined4 uStack_360;
  undefined4 uStack_35c;
  long *local_358 [2];
  long local_348 [2];
  long *local_338;
  long local_330;
  long local_328;
  undefined4 uStack_320;
  undefined4 uStack_31c;
  long *local_318;
  long local_310;
  long local_308;
  long lStack_300;
  long *local_2f8;
  long local_2f0;
  long local_2e8;
  undefined4 uStack_2e0;
  undefined4 uStack_2dc;
  long *local_2d8;
  long local_2d0;
  long local_2c8;
  long lStack_2c0;
  long *local_2b8;
  long local_2b0;
  long local_2a8;
  long lStack_2a0;
  long *local_298;
  long local_290;
  long local_288;
  long lStack_280;
  long *local_278;
  long local_270;
  long local_268;
  long lStack_260;
  long *local_258;
  long local_250;
  long local_248;
  long lStack_240;
  uint local_238;
  value_type local_230;
  uint local_210;
  value_type local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  Vec4 local_1a8;
  Vec4 local_198;
  Vec4 local_188;
  Vec4 local_178;
  AttribSpec local_160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100 [6];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> vStack_70;
  deUint32 local_58;
  undefined1 local_50 [24];
  bool local_38;
  
  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
  local_3b8.field_2._M_allocated_capacity._0_4_ = 0x68676968;
  local_3b8.field_2._M_allocated_capacity._4_2_ = 0x70;
  local_3b8._M_string_length = 5;
  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
  local_3d8.field_2._M_allocated_capacity._0_4_ = 0x6964656d;
  local_3d8._M_string_length = 7;
  local_3d8.field_2._M_allocated_capacity._4_4_ = 0x706d75;
  memset(local_100,0,0xac);
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = 0;
  local_50._9_7_ = 0;
  local_50[0x10] = 0;
  stack0xffffffffffffffc1 = 0;
  std::operator+(&local_1c8,"attribute ",&local_3b8);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  local_2d8 = &local_2c8;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_2c8 = *plVar4;
    lStack_2c0 = plVar2[3];
  }
  else {
    local_2c8 = *plVar4;
    local_2d8 = (long *)*plVar2;
  }
  local_2d0 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_2d8,(ulong)local_3b8._M_dataplus._M_p);
  local_2b8 = &local_2a8;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_2a8 = *plVar4;
    lStack_2a0 = plVar2[3];
  }
  else {
    local_2a8 = *plVar4;
    local_2b8 = (long *)*plVar2;
  }
  local_2b0 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_2b8);
  local_298 = &local_288;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_288 = *plVar4;
    lStack_280 = plVar2[3];
  }
  else {
    local_288 = *plVar4;
    local_298 = (long *)*plVar2;
  }
  local_290 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_298,(ulong)local_3d8._M_dataplus._M_p);
  local_278 = &local_268;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_268 = *plVar4;
    lStack_260 = plVar2[3];
  }
  else {
    local_268 = *plVar4;
    local_278 = (long *)*plVar2;
  }
  local_270 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_278);
  local_338 = &local_328;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_328 = *plVar4;
    uStack_320 = (undefined4)plVar2[3];
    uStack_31c = *(undefined4 *)((long)plVar2 + 0x1c);
  }
  else {
    local_328 = *plVar4;
    local_338 = (long *)*plVar2;
  }
  local_330 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_498[0] = local_488;
  if (shaderType == CASESHADERTYPE_VERTEX) {
    pcVar1 = (funcDefs->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_498,pcVar1,pcVar1 + funcDefs->_M_string_length);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_498,0x1af8059);
  }
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_338,(ulong)local_498[0]);
  local_478 = &local_468;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_468 = *plVar4;
    lStack_460 = plVar2[3];
  }
  else {
    local_468 = *plVar4;
    local_478 = (long *)*plVar2;
  }
  local_470 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_478);
  local_458 = &local_448;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_448 = *plVar4;
    lStack_440 = plVar2[3];
  }
  else {
    local_448 = *plVar4;
    local_458 = (long *)*plVar2;
  }
  local_450 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_458,(ulong)local_3b8._M_dataplus._M_p);
  local_438 = &local_428;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_428 = *plVar4;
    lStack_420 = plVar2[3];
  }
  else {
    local_428 = *plVar4;
    local_438 = (long *)*plVar2;
  }
  local_430 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_438);
  local_418 = &local_408;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_408 = *plVar4;
    uStack_400 = (undefined4)plVar2[3];
    uStack_3fc = *(undefined4 *)((long)plVar2 + 0x1c);
  }
  else {
    local_408 = *plVar4;
    local_418 = (long *)*plVar2;
  }
  local_410 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_358[0] = local_348;
  if (shaderType == CASESHADERTYPE_VERTEX) {
    pcVar1 = (mainStatements->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_358,pcVar1,pcVar1 + mainStatements->_M_string_length);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_358,0x1af8059);
  }
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_418,(ulong)local_358[0]);
  local_258 = &local_248;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_248 = *plVar4;
    lStack_240 = plVar2[3];
  }
  else {
    local_248 = *plVar4;
    local_258 = (long *)*plVar2;
  }
  local_250 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_258);
  local_3f8 = &local_3e8;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_3e8 = *plVar4;
    uStack_3e0 = (undefined4)plVar2[3];
    uStack_3dc = *(undefined4 *)((long)plVar2 + 0x1c);
  }
  else {
    local_3e8 = *plVar4;
    local_3f8 = (long *)*plVar2;
  }
  local_3f0 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_210 = 0;
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_3f8,local_3f0 + (long)local_3f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100 + local_210,&local_208);
  std::operator+(&local_1e8,"varying ",&local_3d8);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  local_378 = &local_368;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_368 = *plVar4;
    uStack_360 = (undefined4)plVar2[3];
    uStack_35c = *(undefined4 *)((long)plVar2 + 0x1c);
  }
  else {
    local_368 = *plVar4;
    local_378 = (long *)*plVar2;
  }
  local_370 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_538[0] = local_528;
  if (shaderType == CASESHADERTYPE_FRAGMENT) {
    pcVar1 = (funcDefs->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_538,pcVar1,pcVar1 + funcDefs->_M_string_length);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_538,0x1af8059);
  }
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_378,(ulong)local_538[0]);
  local_518 = &local_508;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_508 = *plVar4;
    lStack_500 = plVar2[3];
  }
  else {
    local_508 = *plVar4;
    local_518 = (long *)*plVar2;
  }
  local_510 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_518);
  local_4f8 = &local_4e8;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_4e8 = *plVar4;
    lStack_4e0 = plVar2[3];
  }
  else {
    local_4e8 = *plVar4;
    local_4f8 = (long *)*plVar2;
  }
  local_4f0 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_4f8,(ulong)local_3d8._M_dataplus._M_p);
  local_4d8 = &local_4c8;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_4c8 = *plVar4;
    lStack_4c0 = plVar2[3];
  }
  else {
    local_4c8 = *plVar4;
    local_4d8 = (long *)*plVar2;
  }
  local_4d0 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_4d8);
  local_4b8 = &local_4a8;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_4a8 = *plVar4;
    uStack_4a0 = (undefined4)plVar2[3];
    uStack_49c = *(undefined4 *)((long)plVar2 + 0x1c);
  }
  else {
    local_4a8 = *plVar4;
    local_4b8 = (long *)*plVar2;
  }
  local_4b0 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_398[0] = local_388;
  if (shaderType == CASESHADERTYPE_FRAGMENT) {
    pcVar1 = (mainStatements->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_398,pcVar1,pcVar1 + mainStatements->_M_string_length);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_398,0x1af8059);
  }
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_4b8,(ulong)local_398[0]);
  local_318 = &local_308;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_308 = *plVar4;
    lStack_300 = plVar2[3];
  }
  else {
    local_308 = *plVar4;
    local_318 = (long *)*plVar2;
  }
  local_310 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_318);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_2e8 = *plVar4;
    uStack_2e0 = (undefined4)plVar2[3];
    uStack_2dc = *(undefined4 *)((long)plVar2 + 0x1c);
    local_2f8 = &local_2e8;
  }
  else {
    local_2e8 = *plVar4;
    local_2f8 = (long *)*plVar2;
  }
  local_2f0 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_238 = 1;
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,local_2f8,local_2f0 + (long)local_2f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100 + local_238,&local_230);
  local_178.m_data[0] = 1.0;
  local_178.m_data[1] = 0.0;
  local_178.m_data[2] = 0.0;
  local_178.m_data[3] = 0.0;
  local_188.m_data[0] = 0.0;
  local_188.m_data[1] = 1.0;
  local_188.m_data[2] = 0.0;
  local_188.m_data[3] = 0.0;
  local_198.m_data[0] = 0.0;
  local_198.m_data[1] = 0.0;
  local_198.m_data[2] = 1.0;
  local_198.m_data[3] = 0.0;
  local_1a8.m_data[0] = 0.0;
  local_1a8.m_data[1] = 0.0;
  local_1a8.m_data[2] = 0.0;
  local_1a8.m_data[3] = 1.0;
  deqp::gls::AttribSpec::AttribSpec
            (&local_160,"a_value",&local_178,&local_188,&local_198,&local_1a8);
  lVar5 = 0;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&(__return_storage_ptr__->sources).sources[0].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar5),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&local_100[0].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar5));
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x90);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::vector
            (&(__return_storage_ptr__->sources).attribLocationBindings,&vStack_70);
  (__return_storage_ptr__->sources).transformFeedbackBufferMode = local_58;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&(__return_storage_ptr__->sources).transformFeedbackVaryings,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_50);
  (__return_storage_ptr__->sources).separable = local_38;
  std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::vector
            (&__return_storage_ptr__->attributes,1,&local_160,&local_539);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.name._M_dataplus._M_p != &local_160.name.field_2) {
    operator_delete(local_160.name._M_dataplus._M_p,local_160.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8,local_2e8 + 1);
  }
  if (local_318 != &local_308) {
    operator_delete(local_318,local_308 + 1);
  }
  if (local_398[0] != local_388) {
    operator_delete(local_398[0],local_388[0] + 1);
  }
  if (local_4b8 != &local_4a8) {
    operator_delete(local_4b8,local_4a8 + 1);
  }
  if (local_4d8 != &local_4c8) {
    operator_delete(local_4d8,local_4c8 + 1);
  }
  if (local_4f8 != &local_4e8) {
    operator_delete(local_4f8,local_4e8 + 1);
  }
  if (local_518 != &local_508) {
    operator_delete(local_518,local_508 + 1);
  }
  if (local_538[0] != local_528) {
    operator_delete(local_538[0],local_528[0] + 1);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378,local_368 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if (local_3f8 != &local_3e8) {
    operator_delete(local_3f8,local_3e8 + 1);
  }
  if (local_258 != &local_248) {
    operator_delete(local_258,local_248 + 1);
  }
  if (local_358[0] != local_348) {
    operator_delete(local_358[0],local_348[0] + 1);
  }
  if (local_418 != &local_408) {
    operator_delete(local_418,local_408 + 1);
  }
  if (local_438 != &local_428) {
    operator_delete(local_438,local_428 + 1);
  }
  if (local_458 != &local_448) {
    operator_delete(local_458,local_448 + 1);
  }
  if (local_478 != &local_468) {
    operator_delete(local_478,local_468 + 1);
  }
  if (local_498[0] != local_488) {
    operator_delete(local_498[0],local_488[0] + 1);
  }
  if (local_338 != &local_328) {
    operator_delete(local_338,local_328 + 1);
  }
  if (local_278 != &local_268) {
    operator_delete(local_278,local_268 + 1);
  }
  if (local_298 != &local_288) {
    operator_delete(local_298,local_288 + 1);
  }
  if (local_2b8 != &local_2a8) {
    operator_delete(local_2b8,local_2a8 + 1);
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8,local_2c8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&vStack_70);
  lVar5 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar5));
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  pPVar3 = extraout_RAX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,
                    CONCAT44(local_3d8.field_2._M_allocated_capacity._4_4_,
                             local_3d8.field_2._M_allocated_capacity._0_4_) + 1);
    pPVar3 = extraout_RAX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p,
                    CONCAT26(local_3b8.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_3b8.field_2._M_allocated_capacity._4_2_,
                                      local_3b8.field_2._M_allocated_capacity._0_4_)) + 1);
    pPVar3 = extraout_RAX_01;
  }
  return pPVar3;
}

Assistant:

static inline ProgramData defaultProgramData (CaseShaderType shaderType, const string& funcDefs, const string& mainStatements)
{
	const bool		isVertexCase	= shaderType == CASESHADERTYPE_VERTEX;
	const bool		isFragmentCase	= shaderType == CASESHADERTYPE_FRAGMENT;
	const string	vtxPrec			= getShaderPrecision(CASESHADERTYPE_VERTEX);
	const string	fragPrec		= getShaderPrecision(CASESHADERTYPE_FRAGMENT);

	return ProgramData(glu::ProgramSources() << glu::VertexSource(		"attribute " + vtxPrec + " vec4 a_position;\n"
																		"attribute " + vtxPrec + " vec4 a_value;\n"
																		"varying " + fragPrec + " vec4 v_value;\n"
																		+ (isVertexCase ? funcDefs : "") +
																		"void main (void)\n"
																		"{\n"
																		"	gl_Position = a_position;\n"
																		"	" + vtxPrec + " vec4 value = a_value;\n"
																		+ (isVertexCase ? mainStatements : "") +
																		"	v_value = value;\n"
																		"}\n")

											 << glu::FragmentSource(	"varying " + fragPrec + " vec4 v_value;\n"
																		+ (isFragmentCase ? funcDefs : "") +
																		"void main (void)\n"
																		"{\n"
																		"	" + fragPrec + " vec4 value = v_value;\n"
																		+ (isFragmentCase ? mainStatements : "") +
																		"	gl_FragColor = value;\n"
																		"}\n"),
					  gls::AttribSpec("a_value",
									  Vec4(1.0f, 0.0f, 0.0f, 0.0f),
									  Vec4(0.0f, 1.0f, 0.0f, 0.0f),
									  Vec4(0.0f, 0.0f, 1.0f, 0.0f),
									  Vec4(0.0f, 0.0f, 0.0f, 1.0f)));
}